

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::PatternMap::getPatternFromSkeleton
          (PatternMap *this,PtnSkeleton *skeleton,PtnSkeleton **specifiedSkeletonPtr)

{
  PtnSkeleton *pPVar1;
  UBool UVar2;
  UChar baseChar;
  PtnElem *pPVar3;
  
  if (specifiedSkeletonPtr != (PtnSkeleton **)0x0) {
    *specifiedSkeletonPtr = (PtnSkeleton *)0x0;
  }
  baseChar = SkeletonFields::getFirstChar(&skeleton->baseOriginal);
  pPVar3 = getHeader(this,baseChar);
  if (pPVar3 != (PtnElem *)0x0) {
    do {
      pPVar1 = (pPVar3->skeleton).super_LocalPointerBase<icu_63::PtnSkeleton>.ptr;
      if (specifiedSkeletonPtr == (PtnSkeleton **)0x0) {
        UVar2 = SkeletonFields::operator==(&pPVar1->baseOriginal,&skeleton->baseOriginal);
        if (UVar2 != '\0') goto LAB_002d66e4;
      }
      else {
        UVar2 = SkeletonFields::operator==(&pPVar1->original,&skeleton->original);
        if (UVar2 != '\0') {
          if (pPVar3->skeletonWasSpecified != '\0') {
            *specifiedSkeletonPtr =
                 (pPVar3->skeleton).super_LocalPointerBase<icu_63::PtnSkeleton>.ptr;
          }
LAB_002d66e4:
          return &pPVar3->pattern;
        }
      }
      pPVar3 = (pPVar3->next).super_LocalPointerBase<icu_63::PtnElem>.ptr;
    } while (pPVar3 != (PtnElem *)0x0);
  }
  return (UnicodeString *)0x0;
}

Assistant:

const UnicodeString *
PatternMap::getPatternFromSkeleton(const PtnSkeleton& skeleton, const PtnSkeleton** specifiedSkeletonPtr) const { // key to search for
   PtnElem *curElem;

   if (specifiedSkeletonPtr) {
       *specifiedSkeletonPtr = nullptr;
   }

   // find boot entry
   UChar baseChar = skeleton.getFirstChar();
   if ((curElem=getHeader(baseChar))==nullptr) {
       return nullptr;  // no match
   }

   do  {
       UBool equal;
       if (specifiedSkeletonPtr != nullptr) { // called from DateTimePatternGenerator::getBestRaw or addPattern, use original
           equal = curElem->skeleton->original == skeleton.original;
       } else { // called from DateTimePatternGenerator::getRedundants, use baseOriginal
           equal = curElem->skeleton->baseOriginal == skeleton.baseOriginal;
       }
       if (equal) {
           if (specifiedSkeletonPtr && curElem->skeletonWasSpecified) {
               *specifiedSkeletonPtr = curElem->skeleton.getAlias();
           }
           return &(curElem->pattern);
       }
       curElem = curElem->next.getAlias();
   } while (curElem != nullptr);

   return nullptr;
}